

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  FILE *pFVar11;
  void *pvVar12;
  xmlTextReaderPtr reader;
  undefined4 uVar13;
  undefined1 *puVar14;
  uint uVar15;
  char *pcVar16;
  void *ctx;
  int in_R9D;
  ulong uVar17;
  ulong uVar18;
  glob_t globbuf;
  char prefix [500];
  char result [500];
  char err [500];
  char pattern [500];
  int iStack_19c8;
  glob64_t gStack_19b0;
  undefined4 uStack_1968;
  undefined4 uStack_1964;
  short sStack_1960;
  char acStack_1768 [499];
  undefined1 uStack_1575;
  char acStack_1568 [499];
  undefined1 uStack_1375;
  char acStack_1368 [499];
  undefined1 uStack_1175;
  ulong uStack_1170;
  ulong uStack_1168;
  long lStack_1160;
  char *pcStack_1158;
  ulong uStack_1150;
  code *pcStack_1148;
  char *pcStack_1140;
  char *pcStack_1138;
  long lStack_1130;
  undefined4 uStack_1124;
  long lStack_1120;
  glob64_t gStack_1118;
  char acStack_10d0 [499];
  undefined1 uStack_edd;
  undefined1 auStack_ed0 [512];
  char acStack_cd0 [499];
  undefined1 uStack_add;
  char acStack_ad0 [499];
  undefined1 uStack_8dd;
  long lStack_8d8;
  ulong uStack_8d0;
  ulong uStack_8c8;
  char *pcStack_8c0;
  long lStack_8b8;
  code *pcStack_8b0;
  char *local_8a0;
  char *local_898;
  long local_890;
  ulong local_888;
  int local_87c;
  long local_878;
  glob64_t local_870;
  undefined1 local_828 [512];
  char local_628 [499];
  undefined1 local_435;
  char local_428 [499];
  undefined1 local_235;
  char local_228 [499];
  undefined1 local_35;
  
  pcStack_8b0 = (code *)0x107b48;
  local_87c = options;
  pcVar5 = baseFilename(filename);
  pcStack_8b0 = (code *)0x107b58;
  local_898 = filename;
  uVar6 = xmlSchemaNewParserCtxt(filename);
  pcStack_8b0 = (code *)0x107b70;
  xmlSchemaSetParserErrors(uVar6,testErrorHandler,testErrorHandler,uVar6);
  pcStack_8b0 = (code *)0x107b78;
  lVar7 = xmlSchemaParse(uVar6);
  pcStack_8b0 = (code *)0x107b83;
  xmlSchemaFreeParserCtxt(uVar6);
  pcStack_8b0 = (code *)0x107b8b;
  sVar8 = strlen(pcVar5);
  iVar3 = (int)sVar8;
  iVar4 = -1;
  if (0xfffffe10 < iVar3 - 500U) {
    iVar4 = iVar3 + -6;
    if (pcVar5[(long)iVar3 + -6] != '_') {
      iVar4 = iVar3 + -4;
    }
    if (pcVar5[(long)iVar4 + -2] == '_') {
      iVar4 = iVar4 + -2;
    }
    sVar8 = (size_t)iVar4;
    pcStack_8b0 = (code *)0x107be2;
    local_890 = lVar7;
    memcpy(local_828,pcVar5,sVar8);
    local_828[sVar8] = 0;
    pcStack_8b0 = (code *)0x107c09;
    iVar3 = snprintf(local_228,499,"./test/schemas/%s_?.xml",local_828);
    if (0x1f2 < iVar3) {
      local_35 = 0;
    }
    if (pcVar5[sVar8] == '_') {
      pcStack_8b0 = (code *)0x107c33;
      memcpy(local_828,pcVar5,sVar8 + 2);
      local_828[sVar8 + 2] = 0;
    }
    local_870.gl_offs = 0;
    uVar17 = 0;
    pcStack_8b0 = (code *)0x107c63;
    glob64(local_228,8,(__errfunc *)0x0,&local_870);
    lVar7 = local_890;
    if (local_870.gl_pathc != 0) {
      uVar18 = 0;
      uVar17 = 0;
      do {
        testErrorsSize = 0;
        testErrors[0] = '\0';
        local_8a0 = local_870.gl_pathv[uVar18];
        pcStack_8b0 = (code *)0x107ca1;
        pcVar5 = baseFilename(local_8a0);
        pcStack_8b0 = (code *)0x107cac;
        sVar8 = strlen(pcVar5);
        iVar3 = (int)sVar8;
        if ((iVar3 < 7) || (pcVar5[iVar3 - 6] != '_')) {
          pcStack_8b0 = (code *)0x107ee8;
          fprintf(_stderr,"don\'t know how to process %s\n",local_8a0);
        }
        else {
          uVar15 = (uint)pcVar5[iVar3 - 5];
          pcStack_8b0 = (code *)0x107cf2;
          iVar3 = snprintf(local_628,499,"result/schemas/%s_%c",local_828,(ulong)uVar15);
          if (0x1f2 < iVar3) {
            local_435 = 0;
          }
          puVar14 = local_828;
          pcStack_8b0 = (code *)0x107d27;
          iVar3 = snprintf(local_428,499,"result/schemas/%s_%c.err",puVar14,(ulong)uVar15);
          uVar13 = SUB84(puVar14,0);
          if (0x1f2 < iVar3) {
            local_235 = 0;
          }
          if (lVar7 != 0) {
            nb_tests = nb_tests + 1;
            pcStack_8b0 = (code *)0x107d55;
            lVar9 = xmlReadFile(local_8a0,0,local_87c);
            if (lVar9 == 0) {
              pcStack_8b0 = (code *)0x107f0c;
              fprintf(_stderr,"failed to parse instance %s for %s\n",local_8a0,local_898);
              uVar15 = 0xffffffff;
            }
            else {
              pcVar16 = local_628;
              pcStack_8b0 = (code *)0x107d81;
              local_888 = uVar17;
              pcVar10 = resultFilename(pcVar16,temp_directory,".res");
              if (pcVar10 == (char *)0x0) {
                pcStack_8b0 = rngTest;
                schemasTest_cold_2();
                pcStack_1148 = (code *)0x107f9f;
                uStack_1124 = uVar13;
                lStack_8d8 = lVar9;
                uStack_8d0 = uVar17;
                uStack_8c8 = uVar18;
                pcStack_8c0 = pcVar5;
                lStack_8b8 = lVar7;
                pcStack_8b0 = (code *)(ulong)uVar15;
                pcVar5 = baseFilename(pcVar16);
                pcStack_1148 = (code *)0x107faf;
                pcStack_1138 = pcVar16;
                uVar6 = xmlRelaxNGNewParserCtxt(pcVar16);
                pcStack_1148 = (code *)0x107fc7;
                xmlRelaxNGSetParserErrors(uVar6,testErrorHandler,testErrorHandler,uVar6);
                pcStack_1148 = (code *)0x107fcf;
                lVar7 = xmlRelaxNGParse(uVar6);
                pcStack_1148 = (code *)0x107fda;
                xmlRelaxNGFreeParserCtxt(uVar6);
                pcStack_1148 = (code *)0x107fe2;
                sVar8 = strlen(pcVar5);
                iVar3 = -1;
                if ((int)sVar8 - 500U < 0xfffffe11) goto LAB_0010836d;
                uVar17 = (ulong)((int)sVar8 - 4);
                pcStack_1148 = (code *)0x108015;
                memcpy(auStack_ed0,pcVar5,uVar17);
                auStack_ed0[uVar17] = 0;
                pcStack_1148 = (code *)0x10803c;
                iVar3 = snprintf(acStack_ad0,499,"./test/relaxng/%s_?.xml",auStack_ed0);
                if (0x1f2 < iVar3) {
                  uStack_8dd = 0;
                }
                gStack_1118.gl_offs = 0;
                pcStack_1148 = (code *)0x10806f;
                glob64(acStack_ad0,8,(__errfunc *)0x0,&gStack_1118);
                uVar17 = 0;
                if (gStack_1118.gl_pathc == 0) goto LAB_00108363;
                uVar18 = 0;
                uVar17 = 0;
                lStack_1120 = lVar7;
                goto LAB_0010808f;
              }
              pcStack_8b0 = (code *)0x107d9c;
              pFVar11 = fopen64(pcVar10,"wb");
              if (pFVar11 == (FILE *)0x0) {
                pcStack_8b0 = (code *)0x107f1e;
                schemasTest_cold_1();
                uVar15 = 0xffffffff;
                uVar17 = local_888;
              }
              else {
                pcStack_8b0 = (code *)0x107db0;
                uVar6 = xmlSchemaNewValidCtxt(lVar7);
                pcStack_8b0 = (code *)0x107dc8;
                xmlSchemaSetValidErrors(uVar6,testErrorHandler,testErrorHandler,uVar6);
                pcStack_8b0 = (code *)0x107dd8;
                local_878 = lVar9;
                iVar3 = xmlSchemaValidateDoc(uVar6,lVar9);
                pcVar5 = "%s validation generated an internal error\n";
                if (0 < iVar3) {
                  pcVar5 = "%s fails to validate\n";
                }
                if (iVar3 == 0) {
                  pcVar5 = "%s validates\n";
                }
                pcStack_8b0 = (code *)0x107e0b;
                fprintf(pFVar11,pcVar5,local_8a0);
                pcStack_8b0 = (code *)0x107e13;
                fclose(pFVar11);
                pcStack_8b0 = (code *)0x107e23;
                iVar4 = compareFiles(pcVar10,local_628);
                if (iVar4 != 0) {
                  pcStack_8b0 = (code *)0x107f4c;
                  fprintf(_stderr,"Result for %s on %s failed\n",local_8a0,local_898);
                }
                uVar15 = (uint)(iVar4 != 0);
                pcStack_8b0 = (code *)0x107e33;
                unlink(pcVar10);
                pcStack_8b0 = (code *)0x107e3b;
                free(pcVar10);
                uVar17 = local_888;
                lVar7 = local_890;
                if (iVar3 != 0) {
                  pcStack_8b0 = (code *)0x107e5a;
                  iVar3 = compareFileMem(local_428,testErrors,testErrorsSize);
                  uVar17 = local_888;
                  lVar7 = local_890;
                  if (iVar3 != 0) {
                    pcStack_8b0 = (code *)0x107e8a;
                    fprintf(_stderr,"Error for %s on %s failed\n",local_8a0,local_898);
                    uVar15 = 1;
                  }
                }
                pcStack_8b0 = (code *)0x107ea3;
                xmlSchemaFreeValidCtxt(uVar6);
                pcStack_8b0 = (code *)0x107ead;
                xmlFreeDoc(local_878);
              }
            }
            uVar17 = uVar17 & 0xffffffff;
            if (uVar15 != 0) {
              uVar17 = (ulong)uVar15;
            }
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < local_870.gl_pathc);
    }
    iVar4 = (int)uVar17;
    pcStack_8b0 = (code *)0x107f60;
    globfree64(&local_870);
  }
  pcStack_8b0 = (code *)0x107f68;
  xmlSchemaFree(lVar7);
  return iVar4;
LAB_0010808f:
  testErrorsSize = 0;
  testErrors[0] = '\0';
  pcStack_1140 = gStack_1118.gl_pathv[uVar18];
  pcStack_1148 = (code *)0x1080b2;
  pcVar5 = baseFilename(pcStack_1140);
  pcStack_1148 = (code *)0x1080bd;
  sVar8 = strlen(pcVar5);
  iVar3 = (int)sVar8;
  if ((iVar3 < 7) || (pcVar5[iVar3 - 6] != '_')) {
    pcStack_1148 = (code *)0x1082b0;
    fprintf(_stderr,"don\'t know how to process %s\n",pcStack_1140);
  }
  else {
    uVar15 = (uint)pcVar5[iVar3 - 5];
    pcStack_1148 = (code *)0x108100;
    iVar3 = snprintf(acStack_10d0,499,"result/relaxng/%s_%c",auStack_ed0,(ulong)uVar15);
    if (0x1f2 < iVar3) {
      uStack_edd = 0;
    }
    puVar14 = auStack_ed0;
    pcStack_1148 = (code *)0x108135;
    iVar3 = snprintf(acStack_cd0,499,"result/relaxng/%s_%c.err",puVar14,(ulong)uVar15);
    uVar13 = SUB84(puVar14,0);
    if (0x1f2 < iVar3) {
      uStack_add = 0;
    }
    if (lVar7 != 0) {
      nb_tests = nb_tests + 1;
      pcStack_1148 = (code *)0x108162;
      lStack_1130 = xmlReadFile(pcStack_1140,0,uStack_1124);
      if (lStack_1130 == 0) {
        pcStack_1148 = (code *)0x1082d3;
        fprintf(_stderr,"failed to parse instance %s for %s\n",pcStack_1140,pcStack_1138);
        uVar15 = 0xffffffff;
      }
      else {
        pcVar16 = acStack_10d0;
        pcStack_1148 = (code *)0x10818b;
        pcVar10 = resultFilename(pcVar16,temp_directory,".res");
        if (pcVar10 == (char *)0x0) {
          pcStack_1148 = rngStreamTest;
          rngTest_cold_2();
          uStack_1170 = uVar17;
          uStack_1168 = uVar18;
          lStack_1160 = lVar7;
          pcStack_1158 = pcVar5;
          uStack_1150 = uVar17;
          pcStack_1148 = (code *)(ulong)uVar15;
          pcVar5 = baseFilename(pcVar16);
          sVar8 = strlen(pcVar5);
          if ((int)sVar8 - 500U < 0xfffffe11) {
            fprintf(_stderr,"len(base) == %d !\n",sVar8 & 0xffffffff);
            return -1;
          }
          uVar17 = (ulong)((int)sVar8 - 4);
          memcpy(&uStack_1968,pcVar5,uVar17);
          *(undefined1 *)((long)&uStack_1968 + uVar17) = 0;
          if (((sStack_1960 == 0x31 && CONCAT44(uStack_1964,uStack_1968) == 0x5f3031726f747574) ||
              (sStack_1960 == 0x32 && CONCAT44(uStack_1964,uStack_1968) == 0x5f3031726f747574)) ||
             ((char)sStack_1960 == '\0' && CONCAT44(uStack_1964,uStack_1968) == 0x325f33726f747574))
          {
LAB_0010846a:
            bVar2 = true;
          }
          else {
            if ((CONCAT31((undefined3)uStack_1964,uStack_1968._3_1_) == 0x373733 &&
                 uStack_1968 == 0x33373033) ||
               ((char)sStack_1960 == '\0' && CONCAT44(uStack_1964,uStack_1968) == 0x325f38726f747574
               )) goto LAB_0010846a;
            bVar2 = false;
          }
          iStack_19c8 = 0;
          iVar3 = snprintf(acStack_1568,499,"./test/relaxng/%s_?.xml",&uStack_1968);
          if (0x1f2 < iVar3) {
            uStack_1375 = 0;
          }
          gStack_19b0.gl_offs = 0;
          glob64(acStack_1568,8,(__errfunc *)0x0,&gStack_19b0);
          if (gStack_19b0.gl_pathc == 0) goto LAB_00108652;
          uVar17 = 0;
          iStack_19c8 = 0;
          goto LAB_001084f5;
        }
        pcStack_1148 = (code *)0x1081a6;
        pFVar11 = fopen64(pcVar10,"wb");
        if (pFVar11 == (FILE *)0x0) {
          pcStack_1148 = (code *)0x1082e8;
          rngTest_cold_1();
          uVar15 = 0xffffffff;
        }
        else {
          pcStack_1148 = (code *)0x1081ba;
          pvVar12 = (void *)xmlRelaxNGNewValidCtxt(lVar7);
          pcStack_1148 = (code *)0x1081d2;
          xmlRelaxNGSetValidErrors(pvVar12,testErrorHandler,testErrorHandler,pvVar12);
          pcStack_1148 = (code *)0x1081df;
          ctx = pvVar12;
          iVar3 = xmlRelaxNGValidateDoc(pvVar12,lStack_1130);
          pcVar5 = "%s validation generated an internal error\n";
          if (0 < iVar3) {
            pcVar5 = "%s fails to validate\n";
          }
          if (iVar3 == 0) {
            pcVar5 = "%s validates\n";
          }
          pcStack_1148 = (code *)0x10820c;
          testErrorHandler(ctx,pcVar5,pcStack_1140);
          pcStack_1148 = (code *)0x108214;
          fclose(pFVar11);
          pcStack_1148 = (code *)0x108221;
          iVar3 = compareFiles(pcVar10,acStack_10d0);
          if (iVar3 != 0) {
            pcStack_1148 = (code *)0x108317;
            fprintf(_stderr,"Result for %s on %s failed\n",pcStack_1140,pcStack_1138);
          }
          uVar15 = (uint)(iVar3 != 0);
          pcStack_1148 = (code *)0x108231;
          unlink(pcVar10);
          pcStack_1148 = (code *)0x108239;
          free(pcVar10);
          pcStack_1148 = (code *)0x108253;
          iVar3 = compareFileMem(acStack_cd0,testErrors,testErrorsSize);
          if (iVar3 != 0) {
            pcStack_1148 = (code *)0x108343;
            fprintf(_stderr,"Error for %s on %s failed\n",pcStack_1140,pcStack_1138);
            pcStack_1148 = (code *)0x108358;
            printf("%s",testErrors);
            uVar15 = 1;
          }
          pcStack_1148 = (code *)0x108266;
          xmlRelaxNGFreeValidCtxt(pvVar12);
          pcStack_1148 = (code *)0x108270;
          xmlFreeDoc(lStack_1130);
        }
      }
      lVar7 = lStack_1120;
      if (uVar15 != 0) {
        uVar17 = (ulong)uVar15;
      }
    }
  }
  uVar18 = uVar18 + 1;
  if (gStack_1118.gl_pathc <= uVar18) {
LAB_00108363:
    iVar3 = (int)uVar17;
    pcStack_1148 = (code *)0x10836d;
    globfree64(&gStack_1118);
LAB_0010836d:
    pcStack_1148 = (code *)0x108375;
    xmlRelaxNGFree(lVar7);
    return iVar3;
  }
  goto LAB_0010808f;
LAB_001084f5:
  testErrorsSize = 0;
  testErrors[0] = '\0';
  pcVar5 = gStack_19b0.gl_pathv[uVar17];
  pcVar10 = baseFilename(pcVar5);
  sVar8 = strlen(pcVar10);
  iVar3 = (int)sVar8;
  if ((iVar3 < 7) || (pcVar10[iVar3 - 6] != '_')) {
    pcVar10 = "don\'t know how to process %s\n";
LAB_0010863c:
    fprintf(_stderr,pcVar10,pcVar5);
  }
  else {
    cVar1 = pcVar10[iVar3 - 5];
    iVar3 = snprintf(acStack_1368,499,"result/relaxng/%s_%c",&uStack_1968,(ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar3) {
      uStack_1175 = 0;
    }
    iVar3 = snprintf(acStack_1768,499,"result/relaxng/%s_%c.err",&uStack_1968,
                     (ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar3) {
      uStack_1575 = 0;
    }
    reader = (xmlTextReaderPtr)xmlReaderForFile(pcVar5,0,uVar13);
    if (reader == (xmlTextReaderPtr)0x0) {
      fprintf(_stderr,"Failed to build reader for %s\n",pcVar5);
    }
    if (bVar2) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = acStack_1768;
    }
    iVar3 = streamProcessTest(pcVar5,acStack_1368,pcVar10,reader,pcVar16,in_R9D);
    xmlFreeTextReader(reader);
    if (iVar3 != 0) {
      iStack_19c8 = -1;
      pcVar10 = "instance %s failed\n";
      goto LAB_0010863c;
    }
  }
  uVar17 = uVar17 + 1;
  if (gStack_19b0.gl_pathc <= uVar17) {
LAB_00108652:
    globfree64(&gStack_19b0);
    return iStack_19c8;
  }
  goto LAB_001084f5;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserErrors(ctxt, testErrorHandler, testErrorHandler, ctxt);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_?.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = 0;
	testErrors[0] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/schemas/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	if (schemas == NULL) {
	} else {
	    nb_tests++;
	    ret = schemasOneTest(filename, instance, result, err,
	                         options, schemas);
	    if (ret != 0)
		res = ret;
	}
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}